

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::DotProductLayerParams::MergePartialFromCodedStream
          (DotProductLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  unsigned_long uVar6;
  uint tag;
  ulong uVar7;
  pair<unsigned_long,_bool> pVar8;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013663e;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013663e:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\b' || (tag & 0xfffffff8) != 8)) {
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (!bVar4) {
        return false;
      }
    }
    else {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar6 = (unsigned_long)(char)*puVar3, -1 < (long)uVar6))
      {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar8 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar6 = pVar8.first;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->cosinesimilarity_ = uVar6 != 0;
    }
  } while( true );
}

Assistant:

bool DotProductLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DotProductLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool cosineSimilarity = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cosinesimilarity_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DotProductLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DotProductLayerParams)
  return false;
#undef DO_
}